

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model_test.cc
# Opt level: O0

void __thiscall
gtest_suite_FlatBlockEstimatorTest_::ExtractBlock<BitDepthParams<unsigned_short,_10,_true>_>::
TestBody(ExtractBlock<BitDepthParams<unsigned_short,_10,_true>_> *this)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  Message *message;
  AssertHelper *pAVar4;
  byte bVar5;
  double *in_RDI;
  AssertHelper *this_00;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  int x_2;
  int y_2;
  int mid;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  int x_1;
  int y_1;
  vector<double,_std::allocator<double>_> plane;
  vector<double,_std::allocator<double>_> block;
  int x;
  int y;
  int shift;
  int stride;
  int w;
  int h;
  double normalization;
  AssertionResult gtest_ar;
  aom_flat_block_finder_t flat_block_finder;
  int kBlockSize;
  AssertHelper *in_stack_fffffffffffffdc0;
  allocator_type *in_stack_fffffffffffffdc8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffdd0;
  char *in_stack_fffffffffffffdd8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffde8;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_fffffffffffffdf0;
  undefined8 in_stack_fffffffffffffe28;
  size_type __n;
  undefined8 in_stack_fffffffffffffe30;
  aom_flat_block_finder_t *in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  uint8_t *data;
  aom_flat_block_finder_t *block_finder;
  int in_stack_fffffffffffffe60;
  double *in_stack_fffffffffffffe68;
  AssertionResult local_178 [2];
  AssertionResult local_158;
  int local_144;
  int local_140;
  int local_13c;
  AssertionResult local_128 [2];
  AssertionResult local_108;
  int local_f4;
  int local_f0;
  uint8_t local_e9 [9];
  vector<double,_std::allocator<double>_> local_e0;
  undefined1 local_c1 [37];
  int local_9c;
  int local_98;
  undefined4 local_94;
  undefined2 local_8e;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  double abs_error;
  undefined4 in_stack_ffffffffffffff88;
  uint uVar6;
  double in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  AssertionResult local_48 [2];
  double local_20;
  undefined4 local_c;
  
  local_c = 0x10;
  aom_flat_block_finder_init
            (in_stack_fffffffffffffe38,(int)((ulong)in_stack_fffffffffffffe30 >> 0x20),
             (int)in_stack_fffffffffffffe30,(int)((ulong)in_stack_fffffffffffffe28 >> 0x20));
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0,
             (int *)in_stack_fffffffffffffdc8,(int *)in_stack_fffffffffffffdc0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_48);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffdf0);
    in_stack_fffffffffffffe68 =
         (double *)testing::AssertionResult::failure_message((AssertionResult *)0x5b1c27);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffdf0,
               (Type)((ulong)in_stack_fffffffffffffde8 >> 0x20),(char *)in_stack_fffffffffffffde0,
               (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20),(char *)in_stack_fffffffffffffdd0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
               (Message *)in_stack_fffffffffffffe38);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffdc0);
    testing::Message::~Message((Message *)0x5b1c8a);
  }
  uVar6 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5b1d11);
  if (uVar6 == 0) {
    local_84 = 0x20;
    local_88 = 0x20;
    local_8c = 0x20;
    local_8e = 0x80;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
              (in_stack_fffffffffffffdf0,(size_type)in_stack_fffffffffffffde8,
               (value_type_conflict3 *)in_stack_fffffffffffffde0);
    local_94 = 2;
    abs_error = local_20;
    for (local_98 = 0; local_98 < 0x10; local_98 = local_98 + 1) {
      for (local_9c = 0; local_9c < 0x10; local_9c = local_9c + 1) {
        iVar2 = local_9c - local_98;
        bVar5 = (byte)local_94;
        pvVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 2),
                            (long)(local_98 * 0x20 + local_9c));
        *pvVar3 = (value_type)(iVar2 + 0x80 << (bVar5 & 0x1f));
        in_stack_fffffffffffffe60 = local_9c % 2;
        iVar2 = 0x94;
        if ((in_stack_fffffffffffffe60 + local_98 % 2) % 2 != 0) {
          iVar2 = 0x6c;
        }
        bVar5 = (byte)local_94;
        pvVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 2),
                            (long)(local_98 * 0x20 + local_9c + 0x10));
        *pvVar3 = (value_type)(iVar2 << (bVar5 & 0x1f));
      }
    }
    local_c1._1_8_ = 0x3ff0000000000000;
    block_finder = (aom_flat_block_finder_t *)local_c1;
    std::allocator<double>::allocator((allocator<double> *)0x5b1f02);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffde0,(size_type)in_stack_fffffffffffffdd8,
               (value_type_conflict5 *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    std::allocator<double>::~allocator((allocator<double> *)0x5b1f33);
    local_e9[1] = '\0';
    local_e9[2] = '\0';
    local_e9[3] = '\0';
    local_e9[4] = '\0';
    local_e9[5] = '\0';
    local_e9[6] = '\0';
    local_e9[7] = 0xf0;
    local_e9[8] = '?';
    data = local_e9;
    std::allocator<double>::allocator((allocator<double> *)0x5b1f5a);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffde0,(size_type)in_stack_fffffffffffffdd8,
               (value_type_conflict5 *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    std::allocator<double>::~allocator((allocator<double> *)0x5b1f8b);
    iVar2 = 0;
    __n = 0;
    message = (Message *)
              std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 2),0);
    pAVar4 = (AssertHelper *)std::vector<double,_std::allocator<double>_>::operator[](&local_e0,__n)
    ;
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(local_c1 + 9),__n);
    aom_flat_block_finder_extract_block
              (block_finder,data,iVar2,in_stack_fffffffffffffe40,(int)((ulong)message >> 0x20),
               (int)message,in_stack_fffffffffffffe60,in_stack_fffffffffffffe68,in_RDI);
    for (local_f0 = 0; local_f0 < 0x10; local_f0 = local_f0 + 1) {
      for (local_f4 = 0; local_f4 < 0x10; local_f4 = local_f4 + 1) {
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(local_c1 + 9),
                   (long)(local_f0 * 0x10 + local_f4));
        testing::internal::DoubleNearPredFormat
                  (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                   in_stack_ffffffffffffff90,(double)CONCAT44(uVar6,in_stack_ffffffffffffff88),
                   abs_error);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_108);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffdf0);
          testing::AssertionResult::failure_message((AssertionResult *)0x5b2142);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffffdf0,
                     (Type)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                     (char *)in_stack_fffffffffffffde0,
                     (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20),
                     (char *)in_stack_fffffffffffffdd0);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT44(iVar2,in_stack_fffffffffffffe40),message);
          testing::internal::AssertHelper::~AssertHelper(pAVar4);
          testing::Message::~Message((Message *)0x5b219f);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x5b2210);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 2),
                   (long)(local_f0 * 0x20 + local_f4));
        std::vector<double,_std::allocator<double>_>::operator[]
                  (&local_e0,(long)(local_f0 * 0x10 + local_f4));
        testing::internal::DoubleNearPredFormat
                  (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                   in_stack_ffffffffffffff90,(double)CONCAT44(uVar6,in_stack_ffffffffffffff88),
                   abs_error);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_128);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffdf0);
          testing::AssertionResult::failure_message((AssertionResult *)0x5b22f0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffffdf0,
                     (Type)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                     (char *)in_stack_fffffffffffffde0,
                     (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20),
                     (char *)in_stack_fffffffffffffdd0);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT44(iVar2,in_stack_fffffffffffffe40),message);
          testing::internal::AssertHelper::~AssertHelper(pAVar4);
          testing::Message::~Message((Message *)0x5b234d);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x5b23b8);
      }
    }
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 2),0);
    pAVar4 = (AssertHelper *)std::vector<double,_std::allocator<double>_>::operator[](&local_e0,0);
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(local_c1 + 9),0);
    aom_flat_block_finder_extract_block
              (block_finder,data,iVar2,in_stack_fffffffffffffe40,(int)((ulong)message >> 0x20),
               (int)message,in_stack_fffffffffffffe60,in_stack_fffffffffffffe68,in_RDI);
    local_13c = 0x80 << ((byte)local_94 & 0x1f);
    for (local_140 = 0; local_140 < 0x10; local_140 = local_140 + 1) {
      for (local_144 = 0; local_144 < 0x10; local_144 = local_144 + 1) {
        pvVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 2),
                            (long)(local_140 * 0x20 + 0x10 + local_144));
        this_00 = (AssertHelper *)(((double)*pvVar3 - (double)local_13c) / abs_error);
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(local_c1 + 9),
                   (long)(local_140 * 0x10 + local_144));
        testing::internal::DoubleNearPredFormat
                  (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                   in_stack_ffffffffffffff90,(double)CONCAT44(uVar6,in_stack_ffffffffffffff88),
                   abs_error);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_158);
        if (!bVar1) {
          testing::Message::Message((Message *)this_00);
          in_stack_fffffffffffffde8 =
               testing::AssertionResult::failure_message((AssertionResult *)0x5b25a7);
          testing::internal::AssertHelper::AssertHelper
                    (this_00,(Type)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                     (char *)in_stack_fffffffffffffde0,
                     (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20),
                     (char *)in_stack_fffffffffffffdd0);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT44(iVar2,in_stack_fffffffffffffe40),message);
          testing::internal::AssertHelper::~AssertHelper(pAVar4);
          testing::Message::~Message((Message *)0x5b2604);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x5b2675);
        in_stack_fffffffffffffde0 =
             (vector<double,_std::allocator<double>_> *)((double)local_13c / abs_error);
        std::vector<double,_std::allocator<double>_>::operator[]
                  (&local_e0,(long)(local_140 * 0x10 + local_144));
        testing::internal::DoubleNearPredFormat
                  (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                   in_stack_ffffffffffffff90,(double)CONCAT44(uVar6,in_stack_ffffffffffffff88),
                   abs_error);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_178);
        if (!bVar1) {
          testing::Message::Message((Message *)this_00);
          in_stack_fffffffffffffdd8 =
               testing::AssertionResult::failure_message((AssertionResult *)0x5b2730);
          testing::internal::AssertHelper::AssertHelper
                    (this_00,(Type)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                     (char *)in_stack_fffffffffffffde0,
                     (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20),
                     (char *)in_stack_fffffffffffffdd0);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT44(iVar2,in_stack_fffffffffffffe40),message);
          testing::internal::AssertHelper::~AssertHelper(pAVar4);
          testing::Message::~Message((Message *)0x5b278d);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x5b27f8);
      }
    }
    aom_flat_block_finder_free((aom_flat_block_finder_t *)0x5b2842);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffdd0);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffdd0);
  }
  return;
}

Assistant:

TYPED_TEST_P(FlatBlockEstimatorTest, ExtractBlock) {
  const int kBlockSize = 16;
  aom_flat_block_finder_t flat_block_finder;
  ASSERT_EQ(1, aom_flat_block_finder_init(&flat_block_finder, kBlockSize,
                                          this->kBitDepth, this->kUseHighBD));
  const double normalization = flat_block_finder.normalization;

  // Test with an image of more than one block.
  const int h = 2 * kBlockSize;
  const int w = 2 * kBlockSize;
  const int stride = 2 * kBlockSize;
  this->data_.resize(h * stride, 128);

  // Set up the (0,0) block to be a plane and the (0,1) block to be a
  // checkerboard
  const int shift = this->kBitDepth - 8;
  for (int y = 0; y < kBlockSize; ++y) {
    for (int x = 0; x < kBlockSize; ++x) {
      this->data_[y * stride + x] = (-y + x + 128) << shift;
      this->data_[y * stride + x + kBlockSize] =
          ((x % 2 + y % 2) % 2 ? 128 - 20 : 128 + 20) << shift;
    }
  }
  std::vector<double> block(kBlockSize * kBlockSize, 1);
  std::vector<double> plane(kBlockSize * kBlockSize, 1);

  // The block data should be a constant (zero) and the rest of the plane
  // trend is covered in the plane data.
  aom_flat_block_finder_extract_block(&flat_block_finder,
                                      (uint8_t *)&this->data_[0], w, h, stride,
                                      0, 0, &plane[0], &block[0]);
  for (int y = 0; y < kBlockSize; ++y) {
    for (int x = 0; x < kBlockSize; ++x) {
      EXPECT_NEAR(0, block[y * kBlockSize + x], 1e-5);
      EXPECT_NEAR((double)(this->data_[y * stride + x]) / normalization,
                  plane[y * kBlockSize + x], 1e-5);
    }
  }

  // The plane trend is a constant, and the block is a zero mean checkerboard.
  aom_flat_block_finder_extract_block(&flat_block_finder,
                                      (uint8_t *)&this->data_[0], w, h, stride,
                                      kBlockSize, 0, &plane[0], &block[0]);
  const int mid = 128 << shift;
  for (int y = 0; y < kBlockSize; ++y) {
    for (int x = 0; x < kBlockSize; ++x) {
      EXPECT_NEAR(((double)this->data_[y * stride + x + kBlockSize] - mid) /
                      normalization,
                  block[y * kBlockSize + x], 1e-5);
      EXPECT_NEAR(mid / normalization, plane[y * kBlockSize + x], 1e-5);
    }
  }
  aom_flat_block_finder_free(&flat_block_finder);
}